

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int acttab_insert(acttab *p)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  lookahead_action *plVar6;
  ulong uVar7;
  lookahead_action lVar8;
  uint uVar9;
  long lVar10;
  lookahead_action *plVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x231,"int acttab_insert(acttab *)");
  }
  uVar9 = p->nAction;
  uVar19 = p->nActionAlloc;
  iVar5 = p->mxLookahead + uVar9 + 1;
  if ((int)uVar19 <= iVar5) {
    iVar5 = iVar5 + uVar19 + 0x14;
    p->nActionAlloc = iVar5;
    plVar11 = p->aAction;
    plVar6 = (lookahead_action *)realloc(plVar11,(long)iVar5 << 3);
    p->aAction = plVar6;
    if (plVar6 == (lookahead_action *)0x0) {
      acttab_insert_cold_1();
      lVar8 = plVar11[1];
      do {
        if (lVar8 == (lookahead_action)0x0) {
          return 0;
        }
        if ((*(long *)((long)lVar8 + 0x58) == 0) && (0 < (long)*(int *)((long)lVar8 + 0x18))) {
          lVar10 = 0;
          lVar18 = 0;
          do {
            if (lVar18 != 0) break;
            lVar18 = *(long *)(*(long *)((long)lVar8 + 0x20) + lVar10 * 8);
            if (*(int *)(lVar18 + 0xc) == 2) {
              piVar1 = (int *)(lVar18 + 0x54);
              if (0 < (long)*piVar1) {
                plVar2 = (long *)(lVar18 + 0x58);
                lVar14 = 0;
                do {
                  lVar18 = *(long *)(*plVar2 + lVar14 * 8);
                  if (-1 < *(int *)(lVar18 + 0x20)) goto LAB_00103e61;
                  lVar14 = lVar14 + 1;
                } while (*piVar1 != lVar14);
              }
LAB_00103e67:
              lVar18 = 0;
            }
            else {
              if (*(int *)(lVar18 + 0x20) < 0) goto LAB_00103e67;
LAB_00103e61:
              *(long *)((long)lVar8 + 0x58) = lVar18;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != *(int *)((long)lVar8 + 0x18));
        }
        lVar8 = *(lookahead_action *)((long)lVar8 + 0x78);
      } while( true );
    }
    uVar16 = p->nActionAlloc;
    if ((int)uVar19 < (int)uVar16) {
      memset(plVar6 + (int)uVar19,0xff,(ulong)(~uVar19 + uVar16) * 8 + 8);
    }
    uVar9 = p->nAction;
    uVar19 = uVar16;
  }
  if (0 < (int)uVar9) {
    plVar11 = p->aAction;
    iVar5 = p->mnLookahead;
    iVar12 = iVar5 - uVar9;
    uVar13 = (ulong)uVar9;
    uVar7 = (ulong)(uVar9 - 1);
    do {
      iVar12 = iVar12 + 1;
      if ((plVar11[uVar7].lookahead == iVar5) && (plVar11[uVar7].action == p->mnAction)) {
        iVar3 = p->nLookahead;
        if (0 < (long)iVar3) {
          lVar18 = 0;
          do {
            iVar17 = p->aLookahead[lVar18].lookahead;
            uVar16 = (iVar17 - iVar5) + (int)uVar7;
            if (((uVar9 <= uVar16) || (iVar17 != plVar11[uVar16].lookahead)) ||
               (p->aLookahead[lVar18].action != plVar11[uVar16].action)) goto LAB_00103ce4;
            lVar18 = lVar18 + 1;
          } while (iVar3 != lVar18);
        }
        uVar15 = 0;
        iVar17 = 0;
        do {
          iVar17 = iVar17 + (uint)(iVar12 + (int)uVar15 == plVar11[uVar15].lookahead &&
                                  -1 < plVar11[uVar15].lookahead);
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
        if (iVar17 == iVar3) {
          if (0 < (int)uVar13) goto LAB_00103d8c;
          break;
        }
      }
LAB_00103ce4:
      uVar13 = uVar7 & 0xffffffff;
      bVar4 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar4);
  }
  uVar16 = uVar19 - p->mxLookahead;
  if (uVar16 == 0 || (int)uVar19 < p->mxLookahead) {
    uVar7 = 0;
  }
  else {
    plVar11 = p->aAction;
    iVar5 = 0;
    uVar7 = 0;
    do {
      if (plVar11[uVar7].lookahead < 0) {
        if (0 < (long)p->nLookahead) {
          lVar18 = 0;
          do {
            uVar19 = (p->aLookahead[lVar18].lookahead - p->mnLookahead) + (int)uVar7;
            if (((int)uVar19 < 0) || (-1 < plVar11[uVar19].lookahead)) goto LAB_00103d10;
            lVar18 = lVar18 + 1;
          } while (p->nLookahead != lVar18);
        }
        if ((int)uVar9 < 1) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          while (p->mnLookahead + iVar5 + (int)uVar13 != plVar11[uVar13].lookahead) {
            uVar13 = uVar13 + 1;
            if (uVar9 == uVar13) goto LAB_00103d8c;
          }
        }
        if ((uint)uVar13 == uVar9) goto LAB_00103d8c;
      }
LAB_00103d10:
      uVar7 = uVar7 + 1;
      iVar5 = iVar5 + -1;
    } while (uVar7 != uVar16);
    uVar7 = (ulong)uVar16;
  }
LAB_00103d8c:
  if (0 < p->nLookahead) {
    lVar18 = 0;
    do {
      iVar5 = (p->aLookahead[lVar18].lookahead - p->mnLookahead) + (int)uVar7;
      p->aAction[iVar5] = p->aLookahead[lVar18];
      if (p->nAction <= iVar5) {
        p->nAction = iVar5 + 1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < p->nLookahead);
  }
  p->nLookahead = 0;
  return (int)uVar7 - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p){
  int i, j, k, n;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->mxLookahead + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a 
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  for(i=p->nAction-1; i>=0; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<0 ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    for(i=0; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}